

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O0

int have_flag(int argc,char **argv,char *flag)

{
  int iVar1;
  char *in_RDX;
  long in_RSI;
  int in_EDI;
  char **argm;
  undefined8 *local_10;
  
  local_10 = (undefined8 *)(in_RSI + 8);
  while( true ) {
    if (local_10 == (undefined8 *)(in_RSI + (long)in_EDI * 8)) {
      return 0;
    }
    iVar1 = strcmp((char *)*local_10,in_RDX);
    if (iVar1 == 0) break;
    local_10 = local_10 + 1;
  }
  return 1;
}

Assistant:

static int have_flag(int argc, char** argv, char *flag) {
    char** argm = argv + argc;
    argv++;
    while (argv != argm) {
        if (strcmp(*argv, flag) == 0) {
            return 1;
        }
        argv++;
    }
    return 0;
}